

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# objectivec_message.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::objectivec::MessageGenerator::GenerateMessageHeader
          (MessageGenerator *this,Printer *printer)

{
  string *args_1;
  pointer puVar1;
  pointer puVar2;
  long lVar3;
  long lVar4;
  pointer puVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1_00;
  bool bVar6;
  int iVar7;
  FieldDescriptor **ppFVar8;
  FieldGenerator *pFVar9;
  Descriptor *pDVar10;
  long lVar11;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar12;
  unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>
  *generator;
  long lVar13;
  long lVar14;
  pointer puVar15;
  pointer puVar16;
  pointer puVar17;
  allocator_type local_e2;
  value_type local_e1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_e0;
  string message_comments;
  vector<char,_std::allocator<char>_> seen_oneofs;
  SourceLocation location;
  
  if (*(char *)(*(long *)(this->descriptor_ + 0x20) + 0x4b) == '\x01') {
    puVar1 = (this->nested_message_generators_).
             super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar17 = (this->nested_message_generators_).
                   super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar17 != puVar1;
        puVar17 = puVar17 + 1) {
      GenerateMessageHeader
                ((puVar17->_M_t).
                 super___uniq_ptr_impl<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::compiler::objectivec::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>
                 .
                 super__Head_base<0UL,_google::protobuf::compiler::objectivec::MessageGenerator_*,_false>
                 ._M_head_impl,printer);
    }
  }
  else {
    args_1 = &this->class_name_;
    io::Printer::Print<char[10],std::__cxx11::string>
              (printer,"#pragma mark - $classname$\n\n",(char (*) [10])0x3f42d2,args_1);
    if (*(int *)(this->descriptor_ + 4) != 0) {
      ppFVar8 = anon_unknown_7::SortFieldsByNumber(this->descriptor_);
      io::Printer::Print<char[10],std::__cxx11::string>
                (printer,"typedef GPB_ENUM($classname$_FieldNumber) {\n",(char (*) [10])0x3f42d2,
                 args_1);
      io::Printer::Indent(printer);
      if (0 < *(int *)(this->descriptor_ + 4)) {
        lVar13 = 0;
        do {
          pFVar9 = FieldGeneratorMap::get(&this->field_generators_,ppFVar8[lVar13]);
          FieldGenerator::GenerateFieldNumberConstant(pFVar9,printer);
          lVar13 = lVar13 + 1;
        } while (lVar13 < *(int *)(this->descriptor_ + 4));
      }
      io::Printer::Outdent(printer);
      io::Printer::Print<>(printer,"};\n\n");
      operator_delete__(ppFVar8);
    }
    puVar2 = (this->oneof_generators_).
             super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar15 = (this->oneof_generators_).
                   super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar15 != puVar2;
        puVar15 = puVar15 + 1) {
      OneofGenerator::GenerateCaseEnum
                ((puVar15->_M_t).
                 super___uniq_ptr_impl<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::compiler::objectivec::OneofGenerator_*,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>
                 .
                 super__Head_base<0UL,_google::protobuf::compiler::objectivec::OneofGenerator_*,_false>
                 ._M_head_impl,printer);
    }
    message_comments._M_dataplus._M_p = (pointer)&message_comments.field_2;
    message_comments._M_string_length = 0;
    message_comments.field_2._M_local_buf[0] = '\0';
    location.leading_comments._M_dataplus._M_p = (pointer)&location.leading_comments.field_2;
    location.leading_comments._M_string_length = 0;
    location.leading_comments.field_2._M_local_buf[0] = '\0';
    paVar12 = &location.trailing_comments.field_2;
    location.trailing_comments._M_string_length = 0;
    location.trailing_comments.field_2._M_local_buf[0] = '\0';
    location.leading_detached_comments.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    location.leading_detached_comments.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    location.leading_detached_comments.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    location.trailing_comments._M_dataplus._M_p = (pointer)paVar12;
    bVar6 = Descriptor::GetSourceLocation(this->descriptor_,&location);
    if (bVar6) {
      BuildCommentsString_abi_cxx11_
                ((string *)&seen_oneofs,(objectivec *)&location,(SourceLocation *)0x0,
                 SUB81(paVar12,0));
      std::__cxx11::string::operator=((string *)&message_comments,(string *)&seen_oneofs);
      if ((pointer *)
          seen_oneofs.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start !=
          &seen_oneofs.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage) {
        operator_delete(seen_oneofs.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    else {
      std::__cxx11::string::_M_replace
                ((ulong)&message_comments,0,(char *)message_comments._M_string_length,0x3e25d9);
    }
    io::Printer::
    Print<char[10],std::__cxx11::string,char[21],std::__cxx11::string,char[9],std::__cxx11::string>
              (printer,
               "$comments$$deprecated_attribute$GPB_FINAL @interface $classname$ : GPBMessage\n\n",
               (char (*) [10])0x3f42d2,args_1,(char (*) [21])"deprecated_attribute",
               &this->deprecated_attribute_,(char (*) [9])0x4434cd,&message_comments);
    local_e1 = '\0';
    local_e0 = args_1;
    std::vector<char,_std::allocator<char>_>::vector
              (&seen_oneofs,
               (long)(this->oneof_generators_).
                     super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_finish -
               (long)(this->oneof_generators_).
                     super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start >> 3,&local_e1,&local_e2);
    pDVar10 = this->descriptor_;
    if (0 < *(int *)(pDVar10 + 4)) {
      lVar13 = 0;
      lVar14 = 0;
      do {
        lVar3 = *(long *)(pDVar10 + 0x28);
        if ((*(byte *)(lVar3 + 1 + lVar13) & 0x10) == 0) {
          lVar11 = 0;
        }
        else {
          lVar4 = *(long *)(lVar3 + 0x28 + lVar13);
          lVar11 = 0;
          if (((lVar4 != 0) && (lVar11 = lVar4, *(int *)(lVar4 + 4) == 1)) &&
             ((*(byte *)(*(long *)(lVar4 + 0x20) + 1) & 2) != 0)) {
            lVar11 = 0;
          }
        }
        if ((lVar11 != 0) &&
           (iVar7 = (int)((ulong)(lVar11 - *(long *)(*(long *)(lVar11 + 0x10) + 0x30)) >> 3) *
                    -0x33333333,
           seen_oneofs.super__Vector_base<char,_std::allocator<char>_>._M_impl.
           super__Vector_impl_data._M_start[iVar7] == '\0')) {
          seen_oneofs.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start[iVar7] = '\x01';
          OneofGenerator::GeneratePublicCasePropertyDeclaration
                    ((OneofGenerator *)
                     (this->oneof_generators_).
                     super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start[iVar7]._M_t.
                     super___uniq_ptr_impl<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>
                     ._M_t,printer);
        }
        pFVar9 = FieldGeneratorMap::get
                           (&this->field_generators_,(FieldDescriptor *)(lVar3 + lVar13));
        (*pFVar9->_vptr_FieldGenerator[3])(pFVar9,printer);
        lVar14 = lVar14 + 1;
        pDVar10 = this->descriptor_;
        lVar13 = lVar13 + 0x48;
      } while (lVar14 < *(int *)(pDVar10 + 4));
    }
    io::Printer::Print<>(printer,"@end\n\n");
    args_1_00 = local_e0;
    pDVar10 = this->descriptor_;
    if (0 < *(int *)(pDVar10 + 4)) {
      lVar14 = 0;
      lVar13 = 0;
      do {
        pFVar9 = FieldGeneratorMap::get
                           (&this->field_generators_,
                            (FieldDescriptor *)(*(long *)(pDVar10 + 0x28) + lVar14));
        (*pFVar9->_vptr_FieldGenerator[5])(pFVar9,printer);
        lVar13 = lVar13 + 1;
        pDVar10 = this->descriptor_;
        lVar14 = lVar14 + 0x48;
      } while (lVar13 < *(int *)(pDVar10 + 4));
    }
    puVar15 = (this->oneof_generators_).
              super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
    puVar2 = (this->oneof_generators_).
             super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    if (puVar15 != puVar2) {
      do {
        OneofGenerator::GenerateClearFunctionDeclaration
                  ((puVar15->_M_t).
                   super___uniq_ptr_impl<google::protobuf::compiler::objectivec::OneofGenerator,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_google::protobuf::compiler::objectivec::OneofGenerator_*,_std::default_delete<google::protobuf::compiler::objectivec::OneofGenerator>_>
                   .
                   super__Head_base<0UL,_google::protobuf::compiler::objectivec::OneofGenerator_*,_false>
                   ._M_head_impl,printer);
        puVar15 = puVar15 + 1;
      } while (puVar15 != puVar2);
      io::Printer::Print<>(printer,"\n");
    }
    if (0 < *(int *)(this->descriptor_ + 0x7c)) {
      io::Printer::Print<char[10],std::__cxx11::string>
                (printer,"@interface $classname$ (DynamicMethods)\n\n",(char (*) [10])0x3f42d2,
                 args_1_00);
      puVar5 = (this->extension_generators_).
               super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      for (puVar16 = (this->extension_generators_).
                     super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start; puVar16 != puVar5;
          puVar16 = puVar16 + 1) {
        ExtensionGenerator::GenerateMembersHeader
                  ((puVar16->_M_t).
                   super___uniq_ptr_impl<google::protobuf::compiler::objectivec::ExtensionGenerator,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_google::protobuf::compiler::objectivec::ExtensionGenerator_*,_std::default_delete<google::protobuf::compiler::objectivec::ExtensionGenerator>_>
                   .
                   super__Head_base<0UL,_google::protobuf::compiler::objectivec::ExtensionGenerator_*,_false>
                   ._M_head_impl,printer);
      }
      io::Printer::Print<>(printer,"@end\n\n");
    }
    puVar1 = (this->nested_message_generators_).
             super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar17 = (this->nested_message_generators_).
                   super__Vector_base<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>,_std::allocator<std::unique_ptr<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; puVar17 != puVar1;
        puVar17 = puVar17 + 1) {
      GenerateMessageHeader
                ((puVar17->_M_t).
                 super___uniq_ptr_impl<google::protobuf::compiler::objectivec::MessageGenerator,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_google::protobuf::compiler::objectivec::MessageGenerator_*,_std::default_delete<google::protobuf::compiler::objectivec::MessageGenerator>_>
                 .
                 super__Head_base<0UL,_google::protobuf::compiler::objectivec::MessageGenerator_*,_false>
                 ._M_head_impl,printer);
    }
    if (seen_oneofs.super__Vector_base<char,_std::allocator<char>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(seen_oneofs.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&location.leading_detached_comments);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)location.trailing_comments._M_dataplus._M_p != &location.trailing_comments.field_2) {
      operator_delete(location.trailing_comments._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)location.leading_comments._M_dataplus._M_p != &location.leading_comments.field_2) {
      operator_delete(location.leading_comments._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)message_comments._M_dataplus._M_p != &message_comments.field_2) {
      operator_delete(message_comments._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void MessageGenerator::GenerateMessageHeader(io::Printer* printer) {
  // This a a map entry message, just recurse and do nothing directly.
  if (IsMapEntryMessage(descriptor_)) {
    for (const auto& generator : nested_message_generators_) {
      generator->GenerateMessageHeader(printer);
    }
    return;
  }

  printer->Print(
      "#pragma mark - $classname$\n"
      "\n",
      "classname", class_name_);

  if (descriptor_->field_count()) {
    std::unique_ptr<const FieldDescriptor*[]> sorted_fields(
        SortFieldsByNumber(descriptor_));

    printer->Print("typedef GPB_ENUM($classname$_FieldNumber) {\n",
                   "classname", class_name_);
    printer->Indent();

    for (int i = 0; i < descriptor_->field_count(); i++) {
      field_generators_.get(sorted_fields[i])
          .GenerateFieldNumberConstant(printer);
    }

    printer->Outdent();
    printer->Print("};\n\n");
  }

  for (const auto& generator : oneof_generators_) {
    generator->GenerateCaseEnum(printer);
  }

  std::string message_comments;
  SourceLocation location;
  if (descriptor_->GetSourceLocation(&location)) {
    message_comments = BuildCommentsString(location, false);
  } else {
    message_comments = "";
  }

  printer->Print(
      "$comments$$deprecated_attribute$GPB_FINAL @interface $classname$ : GPBMessage\n\n",
      "classname", class_name_,
      "deprecated_attribute", deprecated_attribute_,
      "comments", message_comments);

  std::vector<char> seen_oneofs(oneof_generators_.size(), 0);
  for (int i = 0; i < descriptor_->field_count(); i++) {
    const FieldDescriptor* field = descriptor_->field(i);
    const OneofDescriptor* oneof = field->real_containing_oneof();
    if (oneof) {
      const int oneof_index = oneof->index();
      if (!seen_oneofs[oneof_index]) {
        seen_oneofs[oneof_index] = 1;
        oneof_generators_[oneof_index]->GeneratePublicCasePropertyDeclaration(
            printer);
      }
    }
    field_generators_.get(field).GeneratePropertyDeclaration(printer);
  }

  printer->Print("@end\n\n");

  for (int i = 0; i < descriptor_->field_count(); i++) {
    field_generators_.get(descriptor_->field(i))
        .GenerateCFunctionDeclarations(printer);
  }

  if (!oneof_generators_.empty()) {
    for (const auto& generator : oneof_generators_) {
      generator->GenerateClearFunctionDeclaration(printer);
    }
    printer->Print("\n");
  }

  if (descriptor_->extension_count() > 0) {
    printer->Print("@interface $classname$ (DynamicMethods)\n\n",
                   "classname", class_name_);
    for (const auto& generator : extension_generators_) {
      generator->GenerateMembersHeader(printer);
    }
    printer->Print("@end\n\n");
  }

  for (const auto& generator : nested_message_generators_) {
    generator->GenerateMessageHeader(printer);
  }
}